

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void dense_rankValueFunc(sqlite3_context *pCtx)

{
  sqlite3_context *pCtx_00;
  CallCount *p;
  sqlite3_context *in_stack_ffffffffffffffe8;
  
  pCtx_00 = (sqlite3_context *)sqlite3_aggregate_context(in_stack_ffffffffffffffe8,0);
  if (pCtx_00 != (sqlite3_context *)0x0) {
    if (pCtx_00->pFunc != (FuncDef *)0x0) {
      pCtx_00->pOut = (Mem *)((long)&pCtx_00->pOut->u + 1);
      pCtx_00->pFunc = (FuncDef *)0x0;
    }
    sqlite3_result_int64(pCtx_00,(i64)in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

static void dense_rankValueFunc(sqlite3_context *pCtx){
  struct CallCount *p;
  p = (struct CallCount*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p ){
    if( p->nStep ){
      p->nValue++;
      p->nStep = 0;
    }
    sqlite3_result_int64(pCtx, p->nValue);
  }
}